

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O3

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureDestroyCommand>
          (CCommandBuffer *this,CTextureDestroyCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  CCommand *pCVar3;
  long lVar4;
  undefined4 uVar5;
  CCommand *pCVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar8 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar7 = (uVar1 - uVar8) + 0x20;
  if (uVar7 <= (this->m_CmdBuffer).m_Size) {
    lVar4 = uVar1 - uVar8;
    (this->m_CmdBuffer).m_Used = (uint)uVar7;
    pCVar6 = (CCommand *)(puVar2 + lVar4 + 8);
    if (pCVar6 != (CCommand *)0x0) {
      uVar5 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
      pCVar3 = (Command->super_CCommand).m_pNext;
      pCVar6->m_Cmd = (Command->super_CCommand).m_Cmd;
      *(undefined4 *)&pCVar6->field_0x4 = uVar5;
      *(CCommand **)(puVar2 + lVar4 + 0x10) = pCVar3;
      *(int *)(puVar2 + lVar4 + 0x18) = Command->m_Slot;
      puVar2 = puVar2 + lVar4 + 0x10;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      if (this->m_pCmdBufferTail != (CCommand *)0x0) {
        this->m_pCmdBufferTail->m_pNext = pCVar6;
      }
      if (this->m_pCmdBufferHead == (CCommand *)0x0) {
        this->m_pCmdBufferHead = pCVar6;
      }
      this->m_pCmdBufferTail = pCVar6;
      return true;
    }
  }
  return false;
}

Assistant:

void *Alloc(unsigned Requested, unsigned Alignment = 8) // TODO: use alignof(std::max_align_t)
		{
			size_t Offset = Alignment - (reinterpret_cast<uintptr_t>(m_pData + m_Used) % Alignment);
			if(Requested + Offset + m_Used > m_Size)
				return 0;

			void *pPtr = &m_pData[m_Used + Offset];
			m_Used += Requested + Offset;
			return pPtr;
		}